

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::~ImmutableExtensionGenerator
          (ImmutableExtensionGenerator *this)

{
  ~ImmutableExtensionGenerator(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

ImmutableExtensionGenerator::~ImmutableExtensionGenerator() {}